

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O1

void __thiscall Fl_Window::free_icons(Fl_Window *this)

{
  long *plVar1;
  icon_data *piVar2;
  long lVar3;
  
  piVar2 = this->icon_;
  *(undefined8 *)piVar2 = 0;
  if (*(long *)(piVar2 + 8) != 0) {
    piVar2 = this->icon_;
    if (0 < *(int *)(piVar2 + 0x10)) {
      lVar3 = 0;
      do {
        plVar1 = *(long **)(*(long *)(piVar2 + 8) + lVar3 * 8);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
        lVar3 = lVar3 + 1;
        piVar2 = this->icon_;
      } while (lVar3 < *(int *)(piVar2 + 0x10));
    }
    if (*(void **)(piVar2 + 8) != (void *)0x0) {
      operator_delete__(*(void **)(piVar2 + 8));
    }
    *(undefined8 *)(this->icon_ + 8) = 0;
  }
  *(undefined4 *)(this->icon_ + 0x10) = 0;
  return;
}

Assistant:

void Fl_Window::free_icons() {
  int i;

  icon_->legacy_icon = 0L;

  if (icon_->icons) {
    for (i = 0;i < icon_->count;i++)
      delete icon_->icons[i];
    delete [] icon_->icons;
    icon_->icons = 0L;
  }

  icon_->count = 0;

#ifdef WIN32
  if (icon_->big_icon)
    DestroyIcon(icon_->big_icon);
  if (icon_->small_icon)
    DestroyIcon(icon_->small_icon);

  icon_->big_icon = NULL;
  icon_->small_icon = NULL;
#endif
}